

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O1

Histogram *
Omega_h::get_histogram
          (Histogram *__return_storage_ptr__,Mesh *mesh,Int dim,Int nbins,Real min_value,
          Real max_value,Reals *values)

{
  int *piVar1;
  LO LVar2;
  promoted_t<signed_char> pVar3;
  ulong uVar4;
  Alloc *pAVar5;
  size_t sVar6;
  Bytes marked;
  Read<double> owned_values;
  Bytes floor_marks;
  Alloc *local_138;
  pointer psStack_130;
  Alloc *local_128;
  pointer psStack_120;
  Bytes *local_110;
  Real local_108;
  Alloc *local_100;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  Mesh *local_e8;
  Histogram *local_e0;
  vector<long,_std::allocator<long>_> *local_d8;
  pointer local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  Read<signed_char> local_c0;
  Bytes local_b0;
  Bytes local_a0;
  Read<double> local_90;
  Read<double> local_80;
  Read<double> local_70;
  Alloc *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Alloc *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  CommPtr local_40;
  
  pAVar5 = (values->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    sVar6 = pAVar5->size;
  }
  else {
    sVar6 = (ulong)pAVar5 >> 3;
  }
  local_108 = min_value;
  local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)max_value;
  local_e8 = mesh;
  LVar2 = Mesh::nents(mesh,dim);
  if (LVar2 != (int)(sVar6 >> 3)) {
    fail("assertion %s failed at %s +%d\n","values.size() == mesh->nents(dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
         ,0x11);
  }
  local_50 = (values->write_).shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_48._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(values->write_).shared_alloc_.direct_ptr;
  Mesh::owned_array<double>
            ((Mesh *)&local_100,(Int)local_e8,(Read<double> *)(ulong)(uint)dim,(Int)&local_50);
  pAVar5 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(pAVar5,0x48);
    }
  }
  local_d8 = &__return_storage_ptr__->bins;
  (__return_storage_ptr__->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->min = local_108;
  __return_storage_ptr__->max = (Real)local_f0._M_pi;
  local_e0 = __return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::resize(local_d8,(long)nbins);
  if (0 < nbins) {
    local_d0 = (pointer)(((double)local_f0._M_pi - local_108) / (double)nbins);
    uVar4 = 0;
    local_110 = &local_a0;
    do {
      local_c8 = local_f0._M_pi;
      if (uVar4 != nbins - 1) {
        local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((double)((int)uVar4 + 1) * (double)local_d0 + local_108);
      }
      local_70.write_.shared_alloc_.alloc = local_100;
      if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_70.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
        }
        else {
          local_100->use_count = local_100->use_count + 1;
        }
      }
      local_70.write_.shared_alloc_.direct_ptr = local_f8;
      each_geq_to<double>((Omega_h *)&local_60,&local_70,
                          (double)(int)uVar4 * (double)local_d0 + local_108);
      pAVar5 = local_70.write_.shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      local_128 = (Alloc *)0x0;
      psStack_120 = (pointer)0x0;
      if (uVar4 == nbins - 1) {
        local_80.write_.shared_alloc_.alloc = local_100;
        if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
          }
          else {
            local_100->use_count = local_100->use_count + 1;
          }
        }
        local_80.write_.shared_alloc_.direct_ptr = local_f8;
        each_leq_to<double>((Omega_h *)&local_138,&local_80,(double)local_c8);
        pAVar5 = local_128;
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          piVar1 = &local_128->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_128);
            operator_delete(pAVar5,0x48);
          }
        }
        local_128 = local_138;
        psStack_120 = psStack_130;
        pAVar5 = local_80.write_.shared_alloc_.alloc;
        if ((((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_138->use_count = local_138->use_count + -1;
          local_128 = (Alloc *)(local_138->size * 8 + 1);
        }
      }
      else {
        local_90.write_.shared_alloc_.alloc = local_100;
        if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_90.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
          }
          else {
            local_100->use_count = local_100->use_count + 1;
          }
        }
        local_90.write_.shared_alloc_.direct_ptr = local_f8;
        each_lt<double>((Omega_h *)&local_138,&local_90,(double)local_c8);
        pAVar5 = local_128;
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          piVar1 = &local_128->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_128);
            operator_delete(pAVar5,0x48);
          }
        }
        local_128 = local_138;
        psStack_120 = psStack_130;
        pAVar5 = local_90.write_.shared_alloc_.alloc;
        if ((((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_138->use_count = local_138->use_count + -1;
          local_128 = (Alloc *)(local_138->size * 8 + 1);
        }
      }
      psStack_130 = (pointer)0x0;
      local_138 = (Alloc *)0x0;
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar1 = &pAVar5->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
        }
      }
      local_a0.write_.shared_alloc_.alloc = local_60;
      if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
        }
        else {
          local_60->use_count = local_60->use_count + 1;
        }
      }
      local_a0.write_.shared_alloc_.direct_ptr = local_58._M_pi;
      local_b0.write_.shared_alloc_.alloc = local_128;
      if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_128->size * 8 + 1);
        }
        else {
          local_128->use_count = local_128->use_count + 1;
        }
      }
      local_b0.write_.shared_alloc_.direct_ptr = psStack_120;
      land_each((Omega_h *)&local_138,&local_a0,&local_b0);
      pAVar5 = local_b0.write_.shared_alloc_.alloc;
      if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_a0.write_.shared_alloc_.alloc;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      Mesh::comm(local_e8);
      local_c0.write_.shared_alloc_.alloc = local_138;
      if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_138->size * 8 + 1);
        }
        else {
          local_138->use_count = local_138->use_count + 1;
        }
      }
      local_c0.write_.shared_alloc_.direct_ptr = psStack_130;
      pVar3 = get_sum<signed_char>(&local_40,&local_c0);
      pAVar5 = local_c0.write_.shared_alloc_.alloc;
      (local_d8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = (long)pVar3;
      if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      if (local_40.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pAVar5 = local_138;
      if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
        piVar1 = &local_138->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_138);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_128;
      if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
        piVar1 = &local_128->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_128);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_60;
      if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
        piVar1 = &local_60->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60);
          operator_delete(pAVar5,0x48);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nbins);
  }
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    piVar1 = &local_100->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_100);
      operator_delete(local_100,0x48);
    }
  }
  return local_e0;
}

Assistant:

Histogram get_histogram(Mesh* mesh, Int dim, Int nbins, Real min_value,
    Real max_value, Reals values) {
  OMEGA_H_CHECK(values.size() == mesh->nents(dim));
  auto owned_values = mesh->owned_array(dim, values, 1);
  auto interval = (max_value - min_value) / Real(nbins);
  Histogram histogram;
  histogram.min = min_value;
  histogram.max = max_value;
  histogram.bins.resize(std::size_t(nbins));
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + min_value;
    auto ceil = interval * (i + 1) + min_value;
    if (i == nbins - 1) ceil = max_value;
    auto floor_marks = each_geq_to(owned_values, floor);
    Read<I8> ceil_marks;
    if (i == nbins - 1)
      ceil_marks = each_leq_to(owned_values, ceil);
    else
      ceil_marks = each_lt(owned_values, ceil);
    auto marked = land_each(floor_marks, ceil_marks);
    histogram.bins[std::size_t(i)] = get_sum(mesh->comm(), marked);
  }
  return histogram;
}